

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

CTSize lj_ctype_vlsize(CTState *cts,CType *ct,CTSize nelem)

{
  ushort uVar1;
  CType *pCVar2;
  CTSize local_fc;
  uint local_f0;
  uint local_ec;
  ulong local_e8;
  CType *local_d8;
  CType *local_c8;
  CType *ctf;
  CTypeID fid;
  CTypeID arrid;
  uint64_t xsz;
  CTSize nelem_local;
  CType *ct_local;
  CTState *cts_local;
  CType *ct_1;
  CType *local_40;
  
  local_e8 = 0;
  local_d8 = ct;
  if (ct->info >> 0x1c == 1) {
    local_ec = 0;
    local_e8 = (ulong)ct->size;
    uVar1 = ct->sib;
    while (local_f0 = (uint)uVar1, local_f0 != 0) {
      pCVar2 = cts->tab + local_f0;
      if (pCVar2->info >> 0x1c == 9) {
        local_ec = pCVar2->info & 0xffff;
      }
      uVar1 = pCVar2->sib;
    }
    for (local_c8 = cts->tab + local_ec; local_c8->info >> 0x1c == 8;
        local_c8 = cts->tab + (local_c8->info & 0xffff)) {
    }
    local_d8 = local_c8;
  }
  local_40 = local_d8;
  do {
    local_40 = cts->tab + (local_40->info & 0xffff);
  } while (local_40->info >> 0x1c == 8);
  local_e8 = (ulong)local_40->size * (ulong)nelem + local_e8;
  if (local_e8 < 0x80000000) {
    local_fc = (CTSize)local_e8;
  }
  else {
    local_fc = 0xffffffff;
  }
  return local_fc;
}

Assistant:

CTSize lj_ctype_vlsize(CTState *cts, CType *ct, CTSize nelem)
{
  uint64_t xsz = 0;
  if (ctype_isstruct(ct->info)) {
    CTypeID arrid = 0, fid = ct->sib;
    xsz = ct->size;  /* Add the struct size. */
    while (fid) {
      CType *ctf = ctype_get(cts, fid);
      if (ctype_type(ctf->info) == CT_FIELD)
	arrid = ctype_cid(ctf->info);  /* Remember last field of VLS. */
      fid = ctf->sib;
    }
    ct = ctype_raw(cts, arrid);
  }
  lua_assert(ctype_isvlarray(ct->info));  /* Must be a VLA. */
  ct = ctype_rawchild(cts, ct);  /* Get array element. */
  lua_assert(ctype_hassize(ct->info));
  /* Calculate actual size of VLA and check for overflow. */
  xsz += (uint64_t)ct->size * nelem;
  return xsz < 0x80000000u ? (CTSize)xsz : CTSIZE_INVALID;
}